

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O0

void print_ast(FILE *out,AST *tree)

{
  AST *tree_local;
  FILE *out_local;
  
  if (tree == (AST *)0x0) {
    fprintf((FILE *)out,"NULL");
  }
  else {
    switch(tree->type) {
    case OP_COMMA:
    case OP_ADDITION:
    case OP_SUBTRACTION:
    case OP_MUL:
    case OP_DIV:
    case OP_REMAINDER:
    case OP_ASSIGN:
    case OP_ADD_ASSIGN:
    case OP_SUBTRACT_ASSIGN:
    case OP_MULTIPLY_ASSIGN:
    case OP_REMAINDER_ASSIGN:
    case OP_DIV_ASSIGN:
    case OP_SHIFT_LEFT_ASSIGN:
    case OP_SHIFT_RIGHT_ASSIGN:
    case OP_AND_ASSIGN:
    case OP_XOR_ASSIGN:
    case OP_PIPE_ASSIGN:
    case OP_LOGICAL_OR:
    case OP_LOGICAL_AND:
    case OP_BITWISE_OR:
    case OP_BITWISE_AND:
    case OP_BITWISE_XOR:
    case OP_BITWISE_NOT:
    case OP_MEMBER_TROUGH_PTR:
    case OP_MEMBER:
    case OP_ARR_SUBSCRIPT:
    case OP_SHIFT_LEFT:
    case OP_SHIFT_RIGHT:
    case OP_LESS_EQ:
    case OP_GREATER_EQ:
    case OP_LESS:
    case OP_GREATER:
    case OP_EQUAL:
    case OP_NOT_EQUAL:
      print_binary_expression_tree(out,(AST_Binary_Expression *)tree);
      break;
    case OP_COND:
      print_conditional_expression_tree(out,(AST_Conditional_Expression *)tree);
      break;
    case OP_FUNCTION:
      print_function_expression_tree(out,(AST_Function_Expression *)tree);
      break;
    case OP_NOP:
      fprintf((FILE *)out,"NOP");
      break;
    case OP_LOGICAL_NOT:
    case OP_ADDR_OF:
    case OP_DEREFERENCE:
    case OP_POSTFIX_INC:
    case OP_POSTFIX_DEC:
    case OP_PREFIX_INC:
    case OP_PREFIX_DEC:
    case OP_UNARY_PLUS:
    case OP_UNARY_MINUS:
    case OP_CAST:
    case OP_SIZEOF:
      print_unary_expression_tree(out,(AST_Unary_Expression *)tree);
      break;
    case OP_LVALUE:
      print_lvalue_expression_tree(out,(AST_Lvalue_Expression *)tree);
      break;
    case OP_CONSTANT:
      print_constant_tree(out,(AST_Constant *)tree);
      break;
    case OP_STRING_LITERAL:
      print_string_literal(out,(AST_String_Literal *)tree);
      break;
    case ST_COMPOUND:
      print_compound_statement_tree(out,(AST_Compound_Statement *)tree);
      break;
    default:
      fprintf((FILE *)out,"NOT_POSSIBLE");
      break;
    case ST_SWITCH:
      print_switch_statement_tree(out,(AST_Switch_Statement *)tree);
      break;
    case ST_IF:
      print_if_statement_tree(out,(AST_If_Statement *)tree);
      break;
    case ST_WHILE:
      print_while_statement_tree(out,(AST_While_Statement *)tree);
      break;
    case ST_DO_WHILE:
      print_do_while_statement_tree(out,(AST_Do_While_Statement *)tree);
      break;
    case ST_GOTO:
      print_goto_statement_tree(out,(AST_Goto_Statement *)tree);
      break;
    case ST_LABEL:
    case ST_CASE:
    case ST_DEFAULT:
      print_labeled_statement_tree(out,(AST_Labeled_Statement *)tree);
      break;
    case ST_CONTINUE:
      fprintf((FILE *)out,"continue");
      break;
    case ST_BREAK:
      fprintf((FILE *)out,"break");
      break;
    case ST_RETURN:
      print_return_statement_tree(out,(AST_Return_Statement *)tree);
      break;
    case ST_FOR:
      print_for_statement_tree(out,(AST_For_Statement *)tree);
      break;
    case ST_OBJECT_DECLARATION:
      print_denoted(out,*(Denoted **)(tree + 2));
      fprintf((FILE *)out,"=");
      print_ast(out,*(AST **)(*(long *)(tree + 2) + 0x18));
      break;
    case ST_TYPE_DEFINITION:
      print_denoted(out,*(Denoted **)(tree + 2));
      break;
    case ST_FUNCTION_DEFINITION:
      print_function_definition(out,*(Denoted_Function **)(tree + 2));
      break;
    case ST_FUNCTION_DECLARATION:
      print_denoted(out,*(Denoted **)(tree + 2));
      break;
    case TRANSLATION_UNIT:
      print_translation_unit_tree(out,(AST_Translation_Unit *)tree);
      break;
    case ERROR:
      print_error_tree(out,(AST_Error *)tree);
    }
  }
  return;
}

Assistant:

void print_ast(FILE *out,struct AST* tree)
{
	if(tree==NULL)
	{
		fprintf(out,"NULL");
		return ;
	}
	switch(tree->type)
	{
		case OP_MEMBER_TROUGH_PTR:
		case OP_MEMBER:
		case OP_BITWISE_AND:
		case OP_BITWISE_XOR:
		case OP_BITWISE_NOT:
		case OP_LOGICAL_AND:
		case OP_LOGICAL_OR:
		case OP_XOR_ASSIGN:
		case OP_PIPE_ASSIGN:
		case OP_SHIFT_RIGHT_ASSIGN:
		case OP_ADD_ASSIGN:
		case OP_SUBTRACT_ASSIGN:
		case OP_MULTIPLY_ASSIGN:
		case OP_REMAINDER_ASSIGN:
		case OP_DIV_ASSIGN:
		case OP_SUBTRACTION:
		case OP_MUL:
		case OP_DIV:
		case OP_REMAINDER:
		case OP_EQUAL:
		case OP_LESS:
		case OP_LESS_EQ:
		case OP_SHIFT_LEFT:
		case OP_BITWISE_OR:
		case OP_AND_ASSIGN:
		case OP_ARR_SUBSCRIPT:
		case OP_SHIFT_LEFT_ASSIGN:
		case OP_ASSIGN:
		case OP_ADDITION:
		case OP_COMMA:
		case OP_SHIFT_RIGHT:
		case OP_GREATER_EQ:
		case OP_GREATER:
		case OP_NOT_EQUAL:
			print_binary_expression_tree(out,(struct AST_Binary_Expression*)tree);
			break;
		case OP_COND:
			print_conditional_expression_tree(out,(struct AST_Conditional_Expression*)tree);
			break;
		case OP_FUNCTION:
			print_function_expression_tree(out,(struct AST_Function_Expression*)tree);
			break;
		case OP_LOGICAL_NOT:
		case OP_UNARY_MINUS:
		case OP_SIZEOF:
		case OP_ADDR_OF:
		case OP_DEREFERENCE:
		case OP_POSTFIX_INC:
		case OP_PREFIX_INC:
		case OP_UNARY_PLUS:
		case OP_POSTFIX_DEC:
		case OP_PREFIX_DEC:
		case OP_CAST:
			print_unary_expression_tree(out,(struct AST_Unary_Expression*)tree);
			break;
		case OP_LVALUE:
			print_lvalue_expression_tree(out,(struct AST_Lvalue_Expression*)tree);
			break;
		case OP_STRING_LITERAL:
			print_string_literal(out,(struct AST_String_Literal*)tree);
			break;
		case OP_CONSTANT:
			print_constant_tree(out,(struct AST_Constant*)tree);
			break;
		case OP_NOP:
			fprintf(out,"NOP");
			break;
		case ST_SWITCH:
			print_switch_statement_tree(out,(struct AST_Switch_Statement*)tree);
			break;
		case ST_IF:
			print_if_statement_tree(out,(struct AST_If_Statement*)tree);
			break;
		case ST_WHILE:
			print_while_statement_tree(out,(struct AST_While_Statement*)tree);
			break;
		case ST_DO_WHILE:
			print_do_while_statement_tree(out,(struct AST_Do_While_Statement*)tree);
			break;
		case ST_GOTO:
			print_goto_statement_tree(out,(struct AST_Goto_Statement*)tree);
			break;
		case ST_DEFAULT:
		case ST_LABEL:
		case ST_CASE:
			print_labeled_statement_tree(out,(struct AST_Labeled_Statement*)tree);
			break;
		case ST_CONTINUE:
			fprintf(out,"continue");
			break;
		case ST_BREAK:
			fprintf(out,"break");
			break;
		case ST_RETURN:
			print_return_statement_tree(out,(struct AST_Return_Statement*)tree);
			break;
		case ST_FOR:
			print_for_statement_tree(out,(struct AST_For_Statement*)tree);
			break;
		case ST_COMPOUND:
			print_compound_statement_tree(out,(struct AST_Compound_Statement*)tree);
			break;
		case ST_OBJECT_DECLARATION:
			print_denoted(out,(struct Denoted*)((struct AST_Object_Declaration*)tree)->object);
			fprintf(out,"=");
			print_ast(out,((struct AST_Object_Declaration*)tree)->object->initializer);
			break;
		case ST_TYPE_DEFINITION:
			print_denoted(out,(struct Denoted*)((struct AST_Type_Definition*)tree)->definition);
			break;
		case ST_FUNCTION_DECLARATION:
			print_denoted(out,(struct Denoted*)((struct AST_Function_Declaration*)tree)->function);
			break;
		case ST_FUNCTION_DEFINITION:
			print_function_definition(out,((struct AST_Function_Declaration*)tree)->function);
			break;
		case TRANSLATION_UNIT:
			print_translation_unit_tree(out,(struct AST_Translation_Unit*)tree);
			break;
		case ERROR:
			print_error_tree(out,(struct AST_Error*)tree);
			break;
		default:
			fprintf(out,"NOT_POSSIBLE");break;
	}

}